

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileScalarOperation<false,duckdb::QuantileStandardType>::
     Finalize<double,duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>>
               (QuantileState<signed_char,_duckdb::QuantileStandardType> *state,double *target,
               AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  reference n_p;
  double *in_RSI;
  vector<signed_char,_std::allocator<signed_char>_> *in_RDI;
  double dVar2;
  Interpolator<false> interp;
  QuantileBindData *bind_data;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  FunctionData *in_stack_ffffffffffffffa0;
  QuantileValue *in_stack_ffffffffffffffa8;
  Interpolator<false> *in_stack_ffffffffffffffb0;
  AggregateFinalizeData *in_stack_ffffffffffffffe0;
  
  bVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::empty
                    ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_ffffffffffffffb0)
  ;
  if (bVar1) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffe0);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffffa0);
    FunctionData::Cast<duckdb::QuantileBindData>(in_stack_ffffffffffffffa0);
    n_p = vector<duckdb::QuantileValue,_true>::operator[]
                    ((vector<duckdb::QuantileValue,_true> *)in_stack_ffffffffffffffa0,
                     CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    std::vector<signed_char,_std::allocator<signed_char>_>::size(in_RDI);
    Interpolator<false>::Interpolator
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(idx_t)n_p,
               (bool)in_stack_ffffffffffffff9f);
    std::vector<signed_char,_std::allocator<signed_char>_>::data
              ((vector<signed_char,_std::allocator<signed_char>_> *)0xa690b7);
    dVar2 = Interpolator<false>::Operation<signed_char,double,duckdb::QuantileDirect<signed_char>>
                      ((Interpolator<false> *)bind_data,(char *)interp.end,(Vector *)interp.begin,
                       (QuantileDirect<signed_char> *)interp.CRN);
    *in_RSI = dVar2;
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		Interpolator<DISCRETE> interp(bind_data.quantiles[0], state.v.size(), bind_data.desc);
		target = interp.template Operation<typename STATE::InputType, T>(state.v.data(), finalize_data.result);
	}